

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O1

void __thiscall
r_exec::PrimaryMDLController::abduce_simulated_imdl
          (PrimaryMDLController *this,HLPBindingMap *bm,Fact *super_goal,Fact *f_imdl,bool opposite,
          double confidence,Sim *sim)

{
  atomic_int_fast64_t *paVar1;
  Sim *pSVar2;
  Goal *this_00;
  Goal *this_01;
  Code *actor;
  uint64_t after;
  Fact *pFVar3;
  _GMonitor *m;
  
  _Fact::set_cfd(&f_imdl->super__Fact,confidence);
  this_00 = (Goal *)operator_new(0x160);
  this_01 = _Fact::get_goal(&super_goal->super__Fact);
  actor = Goal::get_actor(this_01);
  pFVar3 = f_imdl;
  Goal::Goal(this_00,&f_imdl->super__Fact,actor,1.0);
  pSVar2 = (Sim *)(this_00->sim).object;
  if (pSVar2 != sim) {
    if (pSVar2 != (Sim *)0x0) {
      LOCK();
      paVar1 = &(pSVar2->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar2->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
        (*(pSVar2->super__Object)._vptr__Object[1])();
      }
    }
    (this_00->sim).object = &sim->super__Object;
    if (sim != (Sim *)0x0) {
      LOCK();
      paVar1 = &(sim->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  after = (*Now)();
  pFVar3 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)pFVar3);
  Fact::Fact(pFVar3,(Code *)this_00,after,after,1.0,1.0);
  m = (_GMonitor *)operator_new(0xb8);
  SRMonitor::SRMonitor((SRMonitor *)m,this,&bm->super_BindingMap,sim->thz,pFVar3,f_imdl);
  PMDLController::add_r_monitor(&this->super_PMDLController,m);
  PMDLController::inject_simulation(&this->super_PMDLController,pFVar3);
  return;
}

Assistant:

void PrimaryMDLController::abduce_simulated_imdl(HLPBindingMap *bm, Fact *super_goal, Fact *f_imdl, bool opposite, double confidence, Sim *sim)   // goal is f->g->f->object or f->g->|f->object; called concurrently by redcue() and _GMonitor::update().
{
    f_imdl->set_cfd(confidence);
    Goal *sub_goal = new Goal(f_imdl, super_goal->get_goal()->get_actor(), 1);
    sub_goal->sim = sim;
    uint64_t now = Now();
    Fact *f_sub_goal = new Fact(sub_goal, now, now, 1, 1);
    add_r_monitor(new SRMonitor(this, bm, sim->thz, f_sub_goal, f_imdl));
    inject_simulation(f_sub_goal);
}